

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCreateTestSourceList.cxx
# Opt level: O3

bool cmCreateTestSourceList
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_type *pvVar2;
  cmMakefile *this;
  pointer pcVar3;
  size_type sVar4;
  int iVar5;
  string *psVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  cmSourceFile *pcVar8;
  value_type *__x;
  string *psVar9;
  pointer pbVar10;
  undefined8 uVar11;
  _Alloc_hider _Var12;
  bool bVar13;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string sourceListValue;
  string func_name_1;
  string local_1d8;
  string functionMapCode;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  string local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  cmNewLineStyle local_13c;
  string local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests_func_name;
  string function;
  string extraInclude;
  string forwardDeclareCode;
  string configFile;
  string local_78;
  pointer local_58;
  string driver;
  
  __x = (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pvVar2 - (long)__x) < 0x41) {
    sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&sourceListValue,"called with wrong number of arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
      operator_delete(sourceListValue._M_dataplus._M_p,
                      sourceListValue.field_2._M_allocated_capacity + 1);
    }
    bVar13 = false;
  }
  else {
    extraInclude._M_dataplus._M_p = (pointer)&extraInclude.field_2;
    extraInclude._M_string_length = 0;
    extraInclude.field_2._M_local_buf[0] = '\0';
    function._M_dataplus._M_p = (pointer)&function.field_2;
    function._M_string_length = 0;
    function.field_2._M_local_buf[0] = '\0';
    tests.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tests.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tests.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (__x != pvVar2) {
      do {
        iVar5 = std::__cxx11::string::compare((char *)__x);
        if (iVar5 == 0) {
          if (__x + 1 ==
              (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&sourceListValue,"incorrect arguments to EXTRA_INCLUDE","");
            std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002a32fd:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sourceListValue._M_dataplus._M_p == &sourceListValue.field_2) goto LAB_002a265a;
            goto LAB_002a264d;
          }
          sourceListValue._M_dataplus._M_p = (pointer)0xa;
          sourceListValue._M_string_length = (long)"!\nConsider to\n  - add #include \"" + 0x16;
          sourceListValue.field_2._M_allocated_capacity = 0;
          sourceListValue.field_2._8_8_ = __x[1]._M_string_length;
          views._M_len = 3;
          views._M_array = (iterator)&sourceListValue;
          cmCatViews(&local_1d8,views);
          psVar6 = &extraInclude;
LAB_002a2582:
          __x = __x + 1;
          std::__cxx11::string::operator=((string *)psVar6,(string *)&local_1d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,
                            (ulong)(local_1d8.field_2._M_allocated_capacity + 1));
          }
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)__x);
          if (iVar5 == 0) {
            if (__x + 1 ==
                (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&sourceListValue,"incorrect arguments to FUNCTION","");
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_002a32fd;
            }
            sourceListValue._M_string_length = (size_type)__x[1]._M_dataplus._M_p;
            sourceListValue._M_dataplus._M_p = (pointer)__x[1]._M_string_length;
            sourceListValue.field_2._M_allocated_capacity = 0;
            sourceListValue.field_2._8_8_ = 0xc;
            views_00._M_len = 2;
            views_00._M_array = (iterator)&sourceListValue;
            cmCatViews(&local_1d8,views_00);
            psVar6 = &function;
            goto LAB_002a2582;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&tests,__x);
        }
        __x = __x + 1;
      } while (__x != (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
    }
    pbVar10 = tests.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_58 = ((tests.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    cmsys::SystemTools::GetFilenameExtension
              (&sourceListValue,
               tests.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1);
    sVar4 = sourceListValue._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
      operator_delete(sourceListValue._M_dataplus._M_p,
                      sourceListValue.field_2._M_allocated_capacity + 1);
    }
    if (sVar4 < 2) {
      sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&sourceListValue,
                 "You must specify a file extension for the test driver file.","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
LAB_002a264d:
        operator_delete(sourceListValue._M_dataplus._M_p,
                        sourceListValue.field_2._M_allocated_capacity + 1);
      }
LAB_002a265a:
      bVar13 = false;
    }
    else {
      this = status->Makefile;
      psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
      sourceListValue._M_string_length = (size_type)(psVar6->_M_dataplus)._M_p;
      sourceListValue._M_dataplus._M_p = (pointer)psVar6->_M_string_length;
      sourceListValue.field_2._M_allocated_capacity = 0;
      local_1d8.field_2._M_allocated_capacity = (long)&local_1d8.field_2 + 8;
      local_1d8._M_dataplus._M_p = (pointer)0x0;
      local_1d8._M_string_length = 1;
      local_1d8.field_2._M_local_buf[8] = '/';
      sourceListValue.field_2._8_8_ = 1;
      views_01._M_len = 3;
      views_01._M_array = (iterator)&sourceListValue;
      cmCatViews(&driver,views_01);
      psVar6 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
      configFile._M_dataplus._M_p = (pointer)&configFile.field_2;
      pcVar3 = (psVar6->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&configFile,pcVar3,pcVar3 + psVar6->_M_string_length);
      std::__cxx11::string::append((char *)&configFile);
      psVar6 = pbVar10 + 2;
      tests_func_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      tests_func_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      tests_func_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      forwardDeclareCode._M_dataplus._M_p = (pointer)&forwardDeclareCode.field_2;
      forwardDeclareCode._M_string_length = 0;
      forwardDeclareCode.field_2._M_local_buf[0] = '\0';
      if (psVar6 == tests.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        functionMapCode._M_dataplus._M_p = (pointer)&functionMapCode.field_2;
        functionMapCode._M_string_length = 0;
        functionMapCode.field_2._M_local_buf[0] = '\0';
      }
      else {
        psVar9 = psVar6;
        do {
          iVar5 = std::__cxx11::string::compare((char *)psVar9);
          if (iVar5 == 0) {
            functionMapCode._M_dataplus._M_p = (pointer)&functionMapCode.field_2;
            functionMapCode._M_string_length = 0;
            functionMapCode.field_2._M_local_buf[0] = '\0';
            if (psVar6 == tests.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002a2dbc;
            break;
          }
          functionMapCode._M_dataplus._M_p = (pointer)&functionMapCode.field_2;
          functionMapCode._M_string_length = 0;
          functionMapCode.field_2._M_local_buf[0] = '\0';
          cmsys::SystemTools::GetFilenamePath(&sourceListValue,psVar9);
          sVar4 = sourceListValue._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
            operator_delete(sourceListValue._M_dataplus._M_p,
                            sourceListValue.field_2._M_allocated_capacity + 1);
          }
          if (sVar4 == 0) {
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&sourceListValue,psVar9);
            std::__cxx11::string::operator=((string *)&functionMapCode,(string *)&sourceListValue);
            uVar11 = sourceListValue.field_2._M_allocated_capacity;
            _Var12 = sourceListValue._M_dataplus;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) goto LAB_002a293c;
          }
          else {
            cmsys::SystemTools::GetFilenamePath(&local_138,psVar9);
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_178,psVar9);
            sourceListValue._M_dataplus._M_p = (pointer)local_138._M_string_length;
            sourceListValue._M_string_length = (size_type)local_138._M_dataplus._M_p;
            sourceListValue.field_2._M_allocated_capacity = (size_type)&local_138;
            local_1d8._M_dataplus._M_p = (pointer)0x0;
            local_1d8._M_string_length = 1;
            local_1d8.field_2._M_allocated_capacity = (long)&local_1d8.field_2 + 8;
            local_1d8.field_2._M_local_buf[8] = '/';
            sourceListValue.field_2._8_8_ = 1;
            views_02._M_len = 3;
            views_02._M_array = (iterator)&sourceListValue;
            cmCatViews(&func_name_1,views_02);
            std::__cxx11::string::operator=((string *)&functionMapCode,(string *)&func_name_1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)func_name_1._M_dataplus._M_p != &func_name_1.field_2) {
              operator_delete(func_name_1._M_dataplus._M_p,
                              CONCAT71(func_name_1.field_2._M_allocated_capacity._1_7_,
                                       func_name_1.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1
                             );
            }
            uVar11 = local_138.field_2._M_allocated_capacity;
            _Var12._M_p = local_138._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
LAB_002a293c:
              operator_delete(_Var12._M_p,uVar11 + 1);
            }
          }
          cmsys::SystemTools::ConvertToUnixSlashes(&functionMapCode);
          cmsys::SystemTools::MakeCidentifier(&sourceListValue,&functionMapCode);
          std::__cxx11::string::operator=((string *)&functionMapCode,(string *)&sourceListValue);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
            operator_delete(sourceListValue._M_dataplus._M_p,
                            sourceListValue.field_2._M_allocated_capacity + 1);
          }
          _Var7 = std::
                  __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                            (tests_func_name.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             tests_func_name.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,&functionMapCode);
          pbVar10 = tests_func_name.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&tests_func_name,&functionMapCode);
          if (_Var7._M_current == pbVar10) {
            sourceListValue._M_dataplus._M_p = (pointer)0x4;
            sourceListValue._M_string_length = (size_type)anon_var_dwarf_934334;
            sourceListValue.field_2._M_allocated_capacity = 0;
            sourceListValue.field_2._8_8_ = functionMapCode._M_string_length;
            views_03._M_len = 3;
            views_03._M_array = (iterator)&sourceListValue;
            cmCatViews(&local_1d8,views_03);
            std::__cxx11::string::_M_append
                      ((char *)&forwardDeclareCode,(ulong)local_1d8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
              operator_delete(local_1d8._M_dataplus._M_p,
                              (ulong)(local_1d8.field_2._M_allocated_capacity + 1));
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)functionMapCode._M_dataplus._M_p != &functionMapCode.field_2) {
            operator_delete(functionMapCode._M_dataplus._M_p,
                            CONCAT71(functionMapCode.field_2._M_allocated_capacity._1_7_,
                                     functionMapCode.field_2._M_local_buf[0]) + 1);
          }
          psVar9 = psVar9 + 1;
        } while (psVar9 != tests.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
        local_180 = &functionMapCode.field_2;
        functionMapCode.field_2._M_local_buf[0] = '\0';
        functionMapCode._M_string_length = 0;
        pbVar10 = tests_func_name.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar9 = psVar6;
        functionMapCode._M_dataplus._M_p = (pointer)local_180;
        do {
          func_name_1._M_dataplus._M_p = (pointer)&func_name_1.field_2;
          func_name_1._M_string_length = 0;
          func_name_1.field_2._M_local_buf[0] = '\0';
          cmsys::SystemTools::GetFilenamePath(&sourceListValue,psVar9);
          sVar4 = sourceListValue._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
            operator_delete(sourceListValue._M_dataplus._M_p,
                            sourceListValue.field_2._M_allocated_capacity + 1);
          }
          if (sVar4 == 0) {
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&sourceListValue,psVar9);
            std::__cxx11::string::operator=((string *)&func_name_1,(string *)&sourceListValue);
            uVar11 = sourceListValue.field_2._M_allocated_capacity;
            _Var12 = sourceListValue._M_dataplus;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) goto LAB_002a2d33;
          }
          else {
            cmsys::SystemTools::GetFilenamePath(&local_178,psVar9);
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_78,psVar9);
            sourceListValue._M_dataplus._M_p = (pointer)local_178._M_string_length;
            sourceListValue._M_string_length = (size_type)local_178._M_dataplus._M_p;
            local_1d8._M_dataplus._M_p = (pointer)0x0;
            local_1d8._M_string_length = 1;
            local_1d8.field_2._M_allocated_capacity = (long)&local_1d8.field_2 + 8;
            local_1d8.field_2._M_local_buf[8] = '/';
            sourceListValue.field_2._8_8_ = 1;
            views_04._M_len = 3;
            views_04._M_array = (iterator)&sourceListValue;
            sourceListValue.field_2._M_allocated_capacity = (size_type)&local_178;
            cmCatViews(&local_138,views_04);
            std::__cxx11::string::operator=((string *)&func_name_1,(string *)&local_138);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            uVar11 = local_178.field_2._M_allocated_capacity;
            _Var12._M_p = local_178._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
LAB_002a2d33:
              operator_delete(_Var12._M_p,uVar11 + 1);
            }
          }
          std::__cxx11::string::append((char *)&functionMapCode);
          std::__cxx11::string::_M_append
                    ((char *)&functionMapCode,(ulong)func_name_1._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&functionMapCode);
          std::__cxx11::string::_M_append
                    ((char *)&functionMapCode,(ulong)(pbVar10->_M_dataplus)._M_p);
          std::__cxx11::string::append((char *)&functionMapCode);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)func_name_1._M_dataplus._M_p != &func_name_1.field_2) {
            operator_delete(func_name_1._M_dataplus._M_p,
                            CONCAT71(func_name_1.field_2._M_allocated_capacity._1_7_,
                                     func_name_1.field_2._M_local_buf[0]) + 1);
          }
          psVar9 = psVar9 + 1;
          pbVar10 = pbVar10 + 1;
        } while (psVar9 != tests.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
LAB_002a2dbc:
      local_180 = &functionMapCode.field_2;
      if (extraInclude._M_string_length != 0) {
        sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&sourceListValue,"CMAKE_TESTDRIVER_EXTRA_INCLUDES","");
        value._M_str = extraInclude._M_dataplus._M_p;
        value._M_len = extraInclude._M_string_length;
        cmMakefile::AddDefinition(this,&sourceListValue,value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
          operator_delete(sourceListValue._M_dataplus._M_p,
                          sourceListValue.field_2._M_allocated_capacity + 1);
        }
      }
      if (function._M_string_length != 0) {
        sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&sourceListValue,"CMAKE_TESTDRIVER_ARGVC_FUNCTION","");
        value_00._M_str = function._M_dataplus._M_p;
        value_00._M_len = function._M_string_length;
        cmMakefile::AddDefinition(this,&sourceListValue,value_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
          operator_delete(sourceListValue._M_dataplus._M_p,
                          sourceListValue.field_2._M_allocated_capacity + 1);
        }
      }
      sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&sourceListValue,"CMAKE_FORWARD_DECLARE_TESTS","");
      value_01._M_str = forwardDeclareCode._M_dataplus._M_p;
      value_01._M_len = forwardDeclareCode._M_string_length;
      cmMakefile::AddDefinition(this,&sourceListValue,value_01);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
        operator_delete(sourceListValue._M_dataplus._M_p,
                        sourceListValue.field_2._M_allocated_capacity + 1);
      }
      sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&sourceListValue,"CMAKE_FUNCTION_TABLE_ENTRIES","");
      value_02._M_str = functionMapCode._M_dataplus._M_p;
      value_02._M_len = functionMapCode._M_string_length;
      cmMakefile::AddDefinition(this,&sourceListValue,value_02);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
        operator_delete(sourceListValue._M_dataplus._M_p,
                        sourceListValue.field_2._M_allocated_capacity + 1);
      }
      cmNewLineStyle::cmNewLineStyle(&local_13c);
      iVar5 = cmMakefile::ConfigureFile(this,&configFile,&driver,false,true,false,0,local_13c);
      bVar13 = iVar5 != 0;
      sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
      sourceListValue._M_string_length = 0;
      sourceListValue.field_2._M_allocated_capacity =
           sourceListValue.field_2._M_allocated_capacity & 0xffffffffffffff00;
      pcVar8 = cmMakefile::GetOrCreateSource(this,&driver,false,Ambiguous);
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"ABSTRACT","");
      paVar1 = &func_name_1.field_2;
      func_name_1._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&func_name_1,"0","");
      cmSourceFile::SetProperty(pcVar8,&local_1d8,&func_name_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)func_name_1._M_dataplus._M_p != paVar1) {
        operator_delete(func_name_1._M_dataplus._M_p,
                        CONCAT71(func_name_1.field_2._M_allocated_capacity._1_7_,
                                 func_name_1.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,
                        (ulong)(local_1d8.field_2._M_allocated_capacity + 1));
      }
      std::__cxx11::string::_M_assign((string *)&sourceListValue);
      if (psVar6 != tests.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pcVar8 = cmMakefile::GetOrCreateSource(this,psVar6,false,Ambiguous);
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"ABSTRACT","");
          func_name_1._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&func_name_1,"0","");
          cmSourceFile::SetProperty(pcVar8,&local_1d8,&func_name_1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)func_name_1._M_dataplus._M_p != paVar1) {
            operator_delete(func_name_1._M_dataplus._M_p,
                            CONCAT71(func_name_1.field_2._M_allocated_capacity._1_7_,
                                     func_name_1.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,
                            (ulong)(local_1d8.field_2._M_allocated_capacity + 1));
          }
          std::__cxx11::string::push_back((char)&sourceListValue);
          std::__cxx11::string::_M_append
                    ((char *)&sourceListValue,(ulong)(psVar6->_M_dataplus)._M_p);
          psVar6 = psVar6 + 1;
        } while (psVar6 != tests.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,local_58,(allocator<char> *)&func_name_1);
      value_03._M_str = sourceListValue._M_dataplus._M_p;
      value_03._M_len = sourceListValue._M_string_length;
      cmMakefile::AddDefinition(this,&local_1d8,value_03);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,
                        (ulong)(local_1d8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
        operator_delete(sourceListValue._M_dataplus._M_p,
                        sourceListValue.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)functionMapCode._M_dataplus._M_p != local_180) {
        operator_delete(functionMapCode._M_dataplus._M_p,
                        CONCAT71(functionMapCode.field_2._M_allocated_capacity._1_7_,
                                 functionMapCode.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)forwardDeclareCode._M_dataplus._M_p != &forwardDeclareCode.field_2) {
        operator_delete(forwardDeclareCode._M_dataplus._M_p,
                        CONCAT71(forwardDeclareCode.field_2._M_allocated_capacity._1_7_,
                                 forwardDeclareCode.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tests_func_name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)configFile._M_dataplus._M_p != &configFile.field_2) {
        operator_delete(configFile._M_dataplus._M_p,configFile.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)driver._M_dataplus._M_p != &driver.field_2) {
        operator_delete(driver._M_dataplus._M_p,driver.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&tests);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)function._M_dataplus._M_p != &function.field_2) {
      operator_delete(function._M_dataplus._M_p,
                      CONCAT71(function.field_2._M_allocated_capacity._1_7_,
                               function.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)extraInclude._M_dataplus._M_p != &extraInclude.field_2) {
      operator_delete(extraInclude._M_dataplus._M_p,
                      CONCAT71(extraInclude.field_2._M_allocated_capacity._1_7_,
                               extraInclude.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar13;
}

Assistant:

bool cmCreateTestSourceList(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("called with wrong number of arguments.");
    return false;
  }

  auto i = args.begin();
  std::string extraInclude;
  std::string function;
  std::vector<std::string> tests;
  // extract extra include and function ot
  for (; i != args.end(); i++) {
    if (*i == "EXTRA_INCLUDE") {
      ++i;
      if (i == args.end()) {
        status.SetError("incorrect arguments to EXTRA_INCLUDE");
        return false;
      }
      extraInclude = cmStrCat("#include \"", *i, "\"\n");
    } else if (*i == "FUNCTION") {
      ++i;
      if (i == args.end()) {
        status.SetError("incorrect arguments to FUNCTION");
        return false;
      }
      function = cmStrCat(*i, "(&ac, &av);\n");
    } else {
      tests.push_back(*i);
    }
  }
  i = tests.begin();

  // Name of the source list

  const char* sourceList = i->c_str();
  ++i;

  // Name of the test driver
  // make sure they specified an extension
  if (cmSystemTools::GetFilenameExtension(*i).size() < 2) {
    status.SetError(
      "You must specify a file extension for the test driver file.");
    return false;
  }
  cmMakefile& mf = status.GetMakefile();
  std::string driver = cmStrCat(mf.GetCurrentBinaryDirectory(), '/', *i);
  ++i;

  std::string configFile = cmSystemTools::GetCMakeRoot();

  configFile += "/Templates/TestDriver.cxx.in";
  // Create the test driver file

  auto testsBegin = i;
  std::vector<std::string> tests_func_name;

  // The rest of the arguments consist of a list of test source files.
  // Sadly, they can be in directories. Let's find a unique function
  // name for the corresponding test, and push it to the tests_func_name
  // list.
  // For the moment:
  //   - replace spaces ' ', ':' and '/' with underscores '_'
  std::string forwardDeclareCode;
  for (i = testsBegin; i != tests.end(); ++i) {
    if (*i == "EXTRA_INCLUDE") {
      break;
    }
    std::string func_name;
    if (!cmSystemTools::GetFilenamePath(*i).empty()) {
      func_name = cmStrCat(cmSystemTools::GetFilenamePath(*i), '/',
                           cmSystemTools::GetFilenameWithoutLastExtension(*i));
    } else {
      func_name = cmSystemTools::GetFilenameWithoutLastExtension(*i);
    }
    cmSystemTools::ConvertToUnixSlashes(func_name);
    func_name = cmSystemTools::MakeCidentifier(func_name);
    bool already_declared =
      std::find(tests_func_name.begin(), tests_func_name.end(), func_name) !=
      tests_func_name.end();
    tests_func_name.push_back(func_name);
    if (!already_declared) {
      forwardDeclareCode += cmStrCat("int ", func_name, "(int, char*[]);\n");
    }
  }

  std::string functionMapCode;
  std::vector<std::string>::iterator j;
  for (i = testsBegin, j = tests_func_name.begin(); i != tests.end();
       ++i, ++j) {
    std::string func_name;
    if (!cmSystemTools::GetFilenamePath(*i).empty()) {
      func_name = cmStrCat(cmSystemTools::GetFilenamePath(*i), '/',
                           cmSystemTools::GetFilenameWithoutLastExtension(*i));
    } else {
      func_name = cmSystemTools::GetFilenameWithoutLastExtension(*i);
    }
    functionMapCode += "  {\n"
                       "    \"";
    functionMapCode += func_name;
    functionMapCode += "\",\n"
                       "    ";
    functionMapCode += *j;
    functionMapCode += "\n"
                       "  },\n";
  }
  if (!extraInclude.empty()) {
    mf.AddDefinition("CMAKE_TESTDRIVER_EXTRA_INCLUDES", extraInclude);
  }
  if (!function.empty()) {
    mf.AddDefinition("CMAKE_TESTDRIVER_ARGVC_FUNCTION", function);
  }
  mf.AddDefinition("CMAKE_FORWARD_DECLARE_TESTS", forwardDeclareCode);
  mf.AddDefinition("CMAKE_FUNCTION_TABLE_ENTRIES", functionMapCode);
  bool res = true;
  if (!mf.ConfigureFile(configFile, driver, false, true, false)) {
    res = false;
  }

  // Construct the source list.
  std::string sourceListValue;
  {
    cmSourceFile* sf = mf.GetOrCreateSource(driver);
    sf->SetProperty("ABSTRACT", "0");
    sourceListValue = driver;
  }
  for (i = testsBegin; i != tests.end(); ++i) {
    cmSourceFile* sf = mf.GetOrCreateSource(*i);
    sf->SetProperty("ABSTRACT", "0");
    sourceListValue += ';';
    sourceListValue += *i;
  }

  mf.AddDefinition(sourceList, sourceListValue);
  return res;
}